

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcommandlinkbutton.cpp
# Opt level: O3

void QCommandLinkButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  bool bVar7;
  
  if (_c == WriteProperty) {
    if (_id == 1) {
      QPushButton::setFlat((QPushButton *)_o,*(bool *)&(((QString *)*_a)->d).d);
      return;
    }
    if (_id == 0) {
      setDescription((QCommandLinkButton *)_o,(QString *)*_a);
      return;
    }
  }
  else if (_c == ReadProperty) {
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      bVar7 = QPushButton::isFlat((QPushButton *)_o);
      *(bool *)puVar1 = bVar7;
    }
    else if (_id == 0) {
      lVar2 = *(long *)(_o + 8);
      piVar3 = *(int **)(lVar2 + 0x2d0);
      uVar4 = *(undefined8 *)(lVar2 + 0x2d8);
      uVar5 = *(undefined8 *)(lVar2 + 0x2e0);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      pQVar6 = (QArrayData *)*puVar1;
      *puVar1 = piVar3;
      puVar1[1] = uVar4;
      puVar1[2] = uVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QCommandLinkButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCommandLinkButton *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->description(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDescription(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}